

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

rbu_file * rbuFindMaindb(rbu_vfs *pRbuVfs,char *zWal,int bRbu)

{
  rbu_file **pprVar1;
  rbu_file *prVar2;
  
  if (pRbuVfs->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(pRbuVfs->mutex);
  }
  if (bRbu == 0) {
    pprVar1 = &pRbuVfs->pMain;
    while (prVar2 = *pprVar1, prVar2 != (rbu_file *)0x0) {
      if (prVar2->zWal == zWal) goto LAB_001b8c1b;
      pprVar1 = &prVar2->pMainNext;
    }
  }
  else {
    pprVar1 = &pRbuVfs->pMainRbu;
    while (prVar2 = *pprVar1, prVar2 != (rbu_file *)0x0) {
      if (prVar2->zWal == zWal) goto LAB_001b8c1b;
      pprVar1 = &prVar2->pMainRbuNext;
    }
  }
  prVar2 = (rbu_file *)0x0;
LAB_001b8c1b:
  if (pRbuVfs->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(pRbuVfs->mutex);
  }
  return prVar2;
}

Assistant:

static rbu_file *rbuFindMaindb(rbu_vfs *pRbuVfs, const char *zWal, int bRbu){
  rbu_file *pDb;
  sqlite3_mutex_enter(pRbuVfs->mutex);
  if( bRbu ){
    for(pDb=pRbuVfs->pMainRbu; pDb && pDb->zWal!=zWal; pDb=pDb->pMainRbuNext){}
  }else{
    for(pDb=pRbuVfs->pMain; pDb && pDb->zWal!=zWal; pDb=pDb->pMainNext){}
  }
  sqlite3_mutex_leave(pRbuVfs->mutex);
  return pDb;
}